

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DisableIffSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableIffSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4)

{
  Token iff;
  Token disable;
  Token closeParen;
  DisableIffSyntax *expr;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  Info *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  expr = (DisableIffSyntax *)
         allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  disable.info = (Info *)*in_RDX;
  disable._0_8_ = in_RCX[1];
  iff.info = (Info *)*in_RCX;
  iff._0_8_ = in_R9[1];
  closeParen.info = in_R8;
  closeParen._0_8_ = in_R9;
  slang::syntax::DisableIffSyntax::DisableIffSyntax
            ((DisableIffSyntax *)*in_R9,disable,iff,*in_RSI,(ExpressionSyntax *)expr,closeParen);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }